

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS VerifyJsonParsesAsDictionaryOfStrings(_Bool IsJson5,char *Json,size_t NumItems)

{
  JL_STATUS JVar1;
  JL_DATA_TYPE JVar2;
  int iVar3;
  char local_78 [4];
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  char valueStr [16];
  char itemName [16];
  char *local_50;
  char *stringPtr;
  JlDataObject *object;
  size_t num;
  _Bool _result_1;
  _Bool _result;
  size_t sStack_30;
  WJTL_STATUS TestReturn;
  size_t errorAtPos;
  JlDataObject *dictionaryObject;
  size_t NumItems_local;
  char *Json_local;
  _Bool IsJson5_local;
  
  errorAtPos = 0;
  sStack_30 = 100;
  num._4_4_ = WJTL_STATUS_SUCCESS;
  dictionaryObject = (JlDataObject *)NumItems;
  NumItems_local = (size_t)Json;
  Json_local._7_1_ = IsJson5;
  JVar1 = JlParseJsonEx(Json,IsJson5,(JlDataObject **)&errorAtPos,&stack0xffffffffffffffd0);
  num._3_1_ = JVar1 == JL_STATUS_SUCCESS;
  WjTestLib_Assert((_Bool)num._3_1_,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &dictionaryObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsDictionaryOfStrings",0x3a2);
  if ((num._3_1_ & 1) == 0) {
    num._4_4_ = WJTL_STATUS_FAILED;
  }
  if (errorAtPos != 0) {
    JVar2 = JlGetObjectType((JlDataObject *)errorAtPos);
    num._2_1_ = JVar2 == JL_DATA_TYPE_DICTIONARY;
    WjTestLib_Assert((_Bool)num._2_1_,
                     "JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsDictionaryOfStrings",0x3a5);
    if ((num._2_1_ & 1) == 0) {
      num._4_4_ = WJTL_STATUS_FAILED;
    }
    JVar2 = JlGetObjectType((JlDataObject *)errorAtPos);
    if (JVar2 == JL_DATA_TYPE_DICTIONARY) {
      for (object = (JlDataObject *)0x1; object <= dictionaryObject;
          object = (JlDataObject *)((long)&object->Type + 1)) {
        stringPtr = (char *)0x0;
        local_50 = (char *)0x0;
        memset(valueStr + 8,0,0x10);
        sprintf(valueStr + 8,"item%u",(ulong)object & 0xffffffff);
        memset(local_78,0,0x10);
        sprintf(local_78,"%u",(ulong)object & 0xffffffff);
        JVar1 = JlGetObjectFromDictionaryByKey
                          ((JlDataObject *)errorAtPos,valueStr + 8,(JlDataObject **)&stringPtr);
        WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                         "((JL_STATUS)(JlGetObjectFromDictionaryByKey( dictionaryObject, itemName, &object ))) == (JL_STATUS_SUCCESS)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                         ,"VerifyJsonParsesAsDictionaryOfStrings",0x3b1);
        if (JVar1 != JL_STATUS_SUCCESS) {
          num._4_4_ = WJTL_STATUS_FAILED;
        }
        if (stringPtr != (char *)0x0) {
          JVar1 = JlGetObjectString((JlDataObject *)stringPtr,&local_50);
          WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                           "((JL_STATUS)(JlGetObjectString( object, &stringPtr ))) == (JL_STATUS_SUCCESS)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                           ,"VerifyJsonParsesAsDictionaryOfStrings",0x3b4);
          if (JVar1 != JL_STATUS_SUCCESS) {
            num._4_4_ = WJTL_STATUS_FAILED;
          }
          iVar3 = strcmp(local_50,local_78);
          WjTestLib_Assert(iVar3 == 0,"strcmp( stringPtr, valueStr ) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                           ,"VerifyJsonParsesAsDictionaryOfStrings",0x3b5);
          if (iVar3 != 0) {
            num._4_4_ = WJTL_STATUS_FAILED;
          }
        }
      }
    }
    JVar1 = JlFreeObjectTree((JlDataObject **)&errorAtPos);
    WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeObjectTree( &dictionaryObject ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsDictionaryOfStrings",0x3bb);
    if (JVar1 != JL_STATUS_SUCCESS) {
      num._4_4_ = WJTL_STATUS_FAILED;
    }
  }
  return num._4_4_;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsDictionaryOfStrings
    (
        bool            IsJson5,
        char const*     Json,
        size_t          NumItems
    )
{
    JlDataObject*   dictionaryObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &dictionaryObject, &errorAtPos ) );
    if( NULL != dictionaryObject )
    {
        JL_ASSERT( JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY );
        if( JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY )
        {
            for( size_t num=1; num<=NumItems; num++ )
            {
                JlDataObject* object = NULL;
                char const* stringPtr = NULL;
                char itemName [16] = {0};
                sprintf( itemName, "item%u", (uint32_t)num );
                char valueStr [16] = {0};
                sprintf( valueStr, "%u", (uint32_t)num );

                JL_ASSERT_SUCCESS( JlGetObjectFromDictionaryByKey( dictionaryObject, itemName, &object ) );
                if( NULL != object )
                {
                    JL_ASSERT_SUCCESS( JlGetObjectString( object, &stringPtr ) );
                    JL_ASSERT( strcmp( stringPtr, valueStr ) == 0 );
                }
            }
        }

        // Clean up
        JL_ASSERT_SUCCESS( JlFreeObjectTree( &dictionaryObject ) );
    }

    return TestReturn;
}